

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Metadata::InternalSwap(Metadata *this,Metadata *other)

{
  int iVar1;
  string *psVar2;
  
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::swap(&(this->userdefined_).map_,&(other->userdefined_).map_);
  psVar2 = (this->shortdescription_).ptr_;
  (this->shortdescription_).ptr_ = (other->shortdescription_).ptr_;
  (other->shortdescription_).ptr_ = psVar2;
  psVar2 = (this->versionstring_).ptr_;
  (this->versionstring_).ptr_ = (other->versionstring_).ptr_;
  (other->versionstring_).ptr_ = psVar2;
  psVar2 = (this->author_).ptr_;
  (this->author_).ptr_ = (other->author_).ptr_;
  (other->author_).ptr_ = psVar2;
  psVar2 = (this->license_).ptr_;
  (this->license_).ptr_ = (other->license_).ptr_;
  (other->license_).ptr_ = psVar2;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void Metadata::InternalSwap(Metadata* other) {
  userdefined_.Swap(&other->userdefined_);
  shortdescription_.Swap(&other->shortdescription_);
  versionstring_.Swap(&other->versionstring_);
  author_.Swap(&other->author_);
  license_.Swap(&other->license_);
  std::swap(_cached_size_, other->_cached_size_);
}